

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,void *value)

{
  appender aVar1;
  basic_format_specs<char> *in_RSI;
  locale_ref in_stack_ffffffffffffffc8;
  locale_ref in_stack_ffffffffffffffd0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffffd8;
  
  basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)0x1737ff);
  locale_ref::locale_ref((locale_ref *)&stack0xffffffffffffffc8);
  aVar1 = write<char,_fmt::v8::appender,_void,_0>
                    ((appender)in_stack_ffffffffffffffd8.container,in_stack_ffffffffffffffc8.locale_
                     ,in_RSI,in_stack_ffffffffffffffd0);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }